

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O3

iff_chunk * __thiscall iff_chunk::find_sub_chunk(iff_chunk *this,char *p_id,uint index)

{
  iff_chunk *piVar1;
  long lVar2;
  
  piVar1 = (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * 0x6db6db6db6db6db7;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    do {
      if (*(int *)p_id == *(int *)piVar1->m_id) {
        if (index < 2) {
          return piVar1;
        }
        index = index - 1;
      }
      piVar1 = piVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return this;
}

Assistant:

const iff_chunk & find_sub_chunk( const char * p_id, unsigned index = 0 ) const
    {
        for ( std::size_t i = 0; i < m_sub_chunks.size(); ++i )
        {
            if ( !memcmp( p_id, m_sub_chunks[ i ].m_id, 4 ) )
            {
                if ( index ) --index;
                if ( !index ) return m_sub_chunks[ i ];
            }
        }
        /*throw exception_io_data( pfc::string_formatter() << "Missing IFF chunk: " << p_id );*/
        return *this;
    }